

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_bool_enum_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_bool_enum_f *pf)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  uint *puVar7;
  flatbuffers_bool_t *pfVar8;
  size_t sVar9;
  
  if (ctx->noenum != '\0') {
    flatcc_json_printer_bool_vector_field(ctx,td,id,name,len);
    return;
  }
  uVar1 = id * 2 + 4;
  if ((uVar1 < (uint)td->vsize) &&
     (uVar6 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar1), uVar6 != 0)) {
    puVar7 = (uint *)(uVar6 + (long)td->table);
  }
  else {
    puVar7 = (uint *)0x0;
  }
  if (puVar7 != (uint *)0x0) {
    iVar3 = td->count;
    td->count = iVar3 + 1;
    if (iVar3 != 0) {
      pcVar4 = ctx->p;
      ctx->p = pcVar4 + 1;
      *pcVar4 = ',';
    }
    uVar6 = (ulong)*puVar7;
    iVar3 = *(int *)((long)puVar7 + uVar6);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar4 = ctx->p;
    ctx->p = pcVar4 + 1;
    *pcVar4 = '[';
    if (iVar3 == 0) {
      pfVar8 = (flatbuffers_bool_t *)((long)puVar7 + uVar6 + 4);
      iVar3 = 0;
    }
    else {
      pcVar4 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar4) {
          (*ctx->flush)(ctx,0);
        }
      }
      else {
        ctx->p = pcVar4 + 1;
        *pcVar4 = '\n';
        sVar9 = (ulong)ctx->indent * (long)ctx->level;
        pcVar4 = ctx->p;
        if (ctx->pflush < pcVar4 + sVar9) {
          if (ctx->pflush <= pcVar4) {
            (*ctx->flush)(ctx,0);
          }
          sVar5 = (long)ctx->pflush - (long)ctx->p;
          if (sVar5 < sVar9) {
            do {
              memset(ctx->p,0x20,sVar5);
              ctx->p = ctx->p + sVar5;
              sVar9 = sVar9 - sVar5;
              (*ctx->flush)(ctx,0);
              sVar5 = (long)ctx->pflush - (long)ctx->p;
            } while (sVar5 < sVar9);
          }
          pcVar4 = ctx->p;
        }
        memset(pcVar4,0x20,sVar9);
        ctx->p = ctx->p + sVar9;
      }
      (*pf)(ctx,*(flatbuffers_bool_t *)((long)puVar7 + uVar6 + 4));
      pfVar8 = (flatbuffers_bool_t *)((long)puVar7 + uVar6 + 5);
      iVar3 = iVar3 + -1;
    }
    for (; iVar3 != 0; iVar3 = iVar3 + -1) {
      pcVar4 = ctx->p;
      ctx->p = pcVar4 + 1;
      *pcVar4 = ',';
      pcVar4 = ctx->p;
      if (ctx->indent == '\0') {
        if (ctx->pflush <= pcVar4) {
          (*ctx->flush)(ctx,0);
        }
      }
      else {
        ctx->p = pcVar4 + 1;
        *pcVar4 = '\n';
        sVar9 = (ulong)ctx->indent * (long)ctx->level;
        pcVar4 = ctx->p;
        if (ctx->pflush < pcVar4 + sVar9) {
          if (ctx->pflush <= pcVar4) {
            (*ctx->flush)(ctx,0);
          }
          sVar5 = (long)ctx->pflush - (long)ctx->p;
          if (sVar5 < sVar9) {
            do {
              memset(ctx->p,0x20,sVar5);
              ctx->p = ctx->p + sVar5;
              sVar9 = sVar9 - sVar5;
              (*ctx->flush)(ctx,0);
              sVar5 = (long)ctx->pflush - (long)ctx->p;
            } while (sVar5 < sVar9);
          }
          pcVar4 = ctx->p;
        }
        memset(pcVar4,0x20,sVar9);
        ctx->p = ctx->p + sVar9;
      }
      (*pf)(ctx,*pfVar8);
      pfVar8 = pfVar8 + 1;
    }
    if (ctx->indent != '\0') {
      pcVar4 = ctx->p;
      ctx->p = pcVar4 + 1;
      *pcVar4 = '\n';
      lVar2 = (long)ctx->level + -1;
      ctx->level = (int)lVar2;
      sVar9 = (ulong)ctx->indent * lVar2;
      pcVar4 = ctx->p;
      if (ctx->pflush < pcVar4 + sVar9) {
        if (ctx->pflush <= pcVar4) {
          (*ctx->flush)(ctx,0);
        }
        sVar5 = (long)ctx->pflush - (long)ctx->p;
        if (sVar5 < sVar9) {
          do {
            memset(ctx->p,0x20,sVar5);
            ctx->p = ctx->p + sVar5;
            sVar9 = sVar9 - sVar5;
            (*ctx->flush)(ctx,0);
            sVar5 = (long)ctx->pflush - (long)ctx->p;
          } while (sVar5 < sVar9);
        }
        pcVar4 = ctx->p;
      }
      memset(pcVar4,0x20,sVar9);
      ctx->p = ctx->p + sVar9;
    }
    pcVar4 = ctx->p;
    ctx->p = pcVar4 + 1;
    *pcVar4 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        size_t size,
        flatcc_json_printer_struct_f pf)
{
    const uint8_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        p += uoffset_size;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
            --count;
        }
        while (count--) {
            p += size;
            print_char(',');
            print_nl();
            print_start('{');
            pf(ctx, p);
            print_end('}');
        }
        print_end(']');
    }
}